

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::TextFormatDecodeData::AddString
          (TextFormatDecodeData *this,int32 key,string *input_for_decode,string *desired_output)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_68;
  string *local_48;
  string *data;
  __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_38;
  __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_30;
  const_iterator i;
  string *desired_output_local;
  string *input_for_decode_local;
  TextFormatDecodeData *pTStack_10;
  int32 key_local;
  TextFormatDecodeData *this_local;
  
  i._M_current = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)desired_output;
  input_for_decode_local._4_4_ = key;
  pTStack_10 = this;
  local_38._M_current =
       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin(&this->entries_);
  __gnu_cxx::
  __normal_iterator<std::pair<int,std::__cxx11::string>const*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>
  ::__normal_iterator<std::pair<int,std::__cxx11::string>*>
            ((__normal_iterator<std::pair<int,std::__cxx11::string>const*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>
              *)&local_30,&local_38);
  while( true ) {
    data = (string *)
           std::
           vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->entries_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&data);
    if (!bVar1) {
      DecodeDataForString(&local_68,input_for_decode,(string *)i._M_current);
      local_48 = &local_68;
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair<int_&,_true>(&local_90,(int *)((long)&input_for_decode_local + 4),&local_68);
      std::
      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&this->entries_,&local_90);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair(&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      return;
    }
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator->(&local_30);
    if (ppVar2->first == input_for_decode_local._4_4_) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&local_30);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"error: duplicate key (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,input_for_decode_local._4_4_);
  poVar3 = std::operator<<(poVar3,") making TextFormat data, input: \"");
  poVar3 = std::operator<<(poVar3,(string *)input_for_decode);
  poVar3 = std::operator<<(poVar3,"\", desired: \"");
  poVar3 = std::operator<<(poVar3,(string *)i._M_current);
  poVar3 = std::operator<<(poVar3,"\".");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  abort();
}

Assistant:

void TextFormatDecodeData::AddString(int32 key,
                                     const string& input_for_decode,
                                     const string& desired_output) {
  for (vector<DataEntry>::const_iterator i = entries_.begin();
       i != entries_.end(); ++i) {
    if (i->first == key) {
      cerr << "error: duplicate key (" << key
           << ") making TextFormat data, input: \"" << input_for_decode
           << "\", desired: \"" << desired_output << "\"." << endl;
      cerr.flush();
      abort();
    }
  }

  const string& data = TextFormatDecodeData::DecodeDataForString(
      input_for_decode, desired_output);
  entries_.push_back(DataEntry(key, data));
}